

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O2

cbtBroadphasePair * __thiscall
cbtSortedOverlappingPairCache::findPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          )

{
  bool bVar1;
  int iVar2;
  cbtBroadphasePair *pcVar3;
  cbtBroadphasePair tmpPair;
  cbtBroadphasePair local_38;
  
  bVar1 = needsBroadphaseCollision(this,proxy0,proxy1);
  if (bVar1) {
    local_38.m_pProxy1 = proxy0;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      local_38.m_pProxy1 = proxy1;
      proxy1 = proxy0;
    }
    local_38.m_algorithm = (cbtCollisionAlgorithm *)0x0;
    local_38.field_3.m_internalInfo1 = (void *)0x0;
    local_38.m_pProxy0 = proxy1;
    iVar2 = cbtAlignedObjectArray<cbtBroadphasePair>::findLinearSearch
                      (&this->m_overlappingPairArray,&local_38);
    pcVar3 = (cbtBroadphasePair *)0x0;
    if (iVar2 < (this->m_overlappingPairArray).m_size) {
      pcVar3 = (this->m_overlappingPairArray).m_data + iVar2;
    }
  }
  else {
    pcVar3 = (cbtBroadphasePair *)0x0;
  }
  return pcVar3;
}

Assistant:

cbtBroadphasePair* cbtSortedOverlappingPairCache::findPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0, proxy1))
		return 0;

	cbtBroadphasePair tmpPair(*proxy0, *proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//cbtAssert(it != m_overlappingPairSet.end());
		cbtBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}